

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O0

TextureParameters * __thiscall
glcts::TextureBufferActiveUniformValidation::getParamsForType
          (TextureBufferActiveUniformValidation *this,GLenum uniformType)

{
  GLenum GVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint local_20;
  GLuint i;
  GLenum uniformType_local;
  TextureBufferActiveUniformValidation *this_local;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                      (&this->m_texture_params);
    if (sVar2 <= local_20) {
      return (TextureParameters *)0x0;
    }
    pvVar3 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::
             operator[](&this->m_texture_params,(ulong)local_20);
    GVar1 = TextureParameters::get_texture_uniform_type(pvVar3);
    if (GVar1 == uniformType) break;
    local_20 = local_20 + 1;
  }
  pvVar3 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::
           operator[](&this->m_texture_params,(ulong)local_20);
  return pvVar3;
}

Assistant:

const TextureParameters* TextureBufferActiveUniformValidation::getParamsForType(glw::GLenum uniformType) const
{
	for (glw::GLuint i = 0; i < m_texture_params.size(); ++i)
	{
		if (m_texture_params[i].get_texture_uniform_type() == uniformType)
		{
			return &m_texture_params[i];
		}
	}
	return DE_NULL;
}